

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# soul_Endpoints.cpp
# Opt level: O0

Type * soul::createMIDIEventEndpointType(void)

{
  Structure *pSVar1;
  ArrayWithPreallocation<soul::Structure::Member,_8UL> *this;
  Type *in_RDI;
  allocator<char> local_91;
  Member local_90;
  undefined1 local_4d;
  allocator<char> local_39;
  string local_38;
  RefCountedPtr<soul::Structure> local_18;
  StructurePtr s;
  
  pSVar1 = (Structure *)operator_new(0x288);
  local_4d = 1;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_38,"Message",&local_39);
  Structure::Structure(pSVar1,&local_38,(void *)0x0);
  local_4d = 0;
  RefCountedPtr<soul::Structure>::RefCountedPtr(&local_18,pSVar1);
  std::__cxx11::string::~string((string *)&local_38);
  std::allocator<char>::~allocator(&local_39);
  pSVar1 = RefCountedPtr<soul::Structure>::operator->(&local_18);
  this = Structure::getMembers(pSVar1);
  Type::Type(&local_90.type,int32);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_90.name,"midiBytes",&local_91)
  ;
  local_90.readWriteCount.numReads = 0;
  local_90.readWriteCount.numWrites = 0;
  ArrayWithPreallocation<soul::Structure::Member,_8UL>::push_back(this,&local_90);
  Structure::Member::~Member(&local_90);
  std::allocator<char>::~allocator(&local_91);
  pSVar1 = RefCountedPtr<soul::Structure>::operator*(&local_18);
  Type::createStruct(in_RDI,pSVar1);
  RefCountedPtr<soul::Structure>::~RefCountedPtr(&local_18);
  return in_RDI;
}

Assistant:

Type createMIDIEventEndpointType()
{
    StructurePtr s (*new Structure ("Message", nullptr));
    s->getMembers().push_back ({ PrimitiveType::int32, "midiBytes" });
    return Type::createStruct (*s);
}